

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O0

bool tinyusdz::LoadUSDAFromMemory
               (uint8_t *addr,size_t length,string *base_dir,Stage *stage,string *warn,string *err,
               USDLoadOptions *options)

{
  Stage *pSVar1;
  USDAReader local_f8 [4];
  USDAReader local_d8 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [35];
  undefined1 local_95;
  undefined4 local_94;
  bool ret_1;
  undefined1 local_6d;
  USDAReaderConfig local_6c;
  bool ret;
  USDAReaderConfig config;
  USDAReader reader;
  StreamReader sr;
  string *err_local;
  string *warn_local;
  Stage *stage_local;
  string *base_dir_local;
  size_t length_local;
  uint8_t *addr_local;
  
  if (addr == (uint8_t *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator=((string *)err,"null pointer for `addr` argument.\n");
    }
    addr_local._7_1_ = false;
  }
  else if (stage == (Stage *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator=((string *)err,"null pointer for `stage` argument.\n");
    }
    addr_local._7_1_ = false;
  }
  else {
    StreamReader::StreamReader((StreamReader *)&reader,addr,length,false);
    usda::USDAReader::USDAReader((USDAReader *)&stack0xffffffffffffff98,(StreamReader *)&reader);
    usda::USDAReaderConfig::USDAReaderConfig(&local_6c);
    local_6c.strict_allowedToken_check = (bool)(options->strict_allowedToken_check & 1);
    local_6c.allow_unknown_apiSchema = (bool)((options->strict_apiSchema_check ^ 0xffU) & 1);
    usda::USDAReader::set_reader_config((USDAReader *)&stack0xffffffffffffff98,&local_6c);
    usda::USDAReader::SetBaseDir((USDAReader *)&stack0xffffffffffffff98,base_dir);
    local_6d = usda::USDAReader::Read((USDAReader *)&stack0xffffffffffffff98,Toplevel,false);
    if ((bool)local_6d) {
      local_95 = usda::USDAReader::ReconstructStage((USDAReader *)&stack0xffffffffffffff98);
      if ((bool)local_95) {
        pSVar1 = usda::USDAReader::GetStage((USDAReader *)&stack0xffffffffffffff98);
        Stage::operator=(stage,pSVar1);
        if (warn != (string *)0x0) {
          usda::USDAReader::GetWarning_abi_cxx11_(local_f8);
          ::std::__cxx11::string::operator+=((string *)warn,(string *)local_f8);
          ::std::__cxx11::string::~string((string *)local_f8);
        }
        addr_local._7_1_ = true;
      }
      else {
        if (err != (string *)0x0) {
          ::std::__cxx11::string::operator+=
                    ((string *)err,"Failed to reconstruct Stage from USDA:\n");
          usda::USDAReader::GetError_abi_cxx11_(local_d8);
          ::std::operator+(local_b8,(char *)local_d8);
          ::std::__cxx11::string::operator+=((string *)err,(string *)local_b8);
          ::std::__cxx11::string::~string((string *)local_b8);
          ::std::__cxx11::string::~string((string *)local_d8);
        }
        addr_local._7_1_ = false;
      }
    }
    else {
      if (err != (string *)0x0) {
        ::std::__cxx11::string::operator+=((string *)err,"Failed to parse USDA\n");
        usda::USDAReader::GetError_abi_cxx11_((USDAReader *)&stack0xffffffffffffff70);
        ::std::__cxx11::string::operator+=((string *)err,(string *)&stack0xffffffffffffff70);
        ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
      }
      addr_local._7_1_ = false;
    }
    local_94 = 1;
    usda::USDAReader::~USDAReader((USDAReader *)&stack0xffffffffffffff98);
  }
  return addr_local._7_1_;
}

Assistant:

bool LoadUSDAFromMemory(const uint8_t *addr, const size_t length,
                        const std::string &base_dir, Stage *stage,
                        std::string *warn, std::string *err,
                        const USDLoadOptions &options) {
  if (addr == nullptr) {
    if (err) {
      (*err) = "null pointer for `addr` argument.\n";
    }
    return false;
  }

  if (stage == nullptr) {
    if (err) {
      (*err) = "null pointer for `stage` argument.\n";
    }
    return false;
  }

  tinyusdz::StreamReader sr(addr, length, /* swap endian */ false);
  tinyusdz::usda::USDAReader reader(&sr);

  tinyusdz::usda::USDAReaderConfig config;
  config.strict_allowedToken_check = options.strict_allowedToken_check;
  config.allow_unknown_apiSchema = !options.strict_apiSchema_check;
  reader.set_reader_config(config);

  reader.SetBaseDir(base_dir);

  {
    bool ret = reader.Read();

    if (!ret) {
      if (err) {
        (*err) += "Failed to parse USDA\n";
        (*err) += reader.GetError();
      }

      return false;
    }
  }

  {
    bool ret = reader.ReconstructStage();
    if (!ret) {
      if (err) {
        (*err) += "Failed to reconstruct Stage from USDA:\n";
        (*err) += reader.GetError() + "\n";
      }
      return false;
    }
  }

  (*stage) = reader.GetStage();

  if (warn) {
    (*warn) += reader.GetWarning();
  }

  return true;
}